

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O0

LY_ERR iff_stack_push(iff_stack *stack,uint8_t value)

{
  size_t sVar1;
  uint8_t *puVar2;
  uint8_t value_local;
  iff_stack *stack_local;
  
  if (stack->index == stack->size) {
    stack->size = stack->size + 4;
    puVar2 = (uint8_t *)ly_realloc(stack->stack,stack->size);
    stack->stack = puVar2;
    if (stack->stack == (uint8_t *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","iff_stack_push");
      stack->size = 0;
      return LY_EMEM;
    }
  }
  sVar1 = stack->index;
  stack->index = sVar1 + 1;
  stack->stack[sVar1] = value;
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
iff_stack_push(struct iff_stack *stack, uint8_t value)
{
    if (stack->index == stack->size) {
        stack->size += IFF_STACK_SIZE_STEP;
        stack->stack = ly_realloc(stack->stack, stack->size * sizeof *stack->stack);
        LY_CHECK_ERR_RET(!stack->stack, LOGMEM(NULL); stack->size = 0, LY_EMEM);
    }
    stack->stack[stack->index++] = value;
    return LY_SUCCESS;
}